

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

ssize_t __thiscall QPDFWriter::write(QPDFWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  size_t sVar2;
  element_type *peVar3;
  Buffer *pBVar4;
  ssize_t extraout_RAX;
  unsigned_long local_10;
  
  doWriteSetup(this);
  sVar2 = QPDF::getObjectCount
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pdf);
  local_10 = sVar2 << (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->linearized & 0x3fU);
  iVar1 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_10);
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  events_expected = iVar1;
  prepareFileForWrite(this);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      linearized == true) {
    writeLinearized(this);
  }
  else {
    writeStandard(this);
  }
  ::qpdf::pl::Count::finish
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->close_file == true) {
    fclose((FILE *)peVar3->file);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar3->file = (FILE *)0x0;
  if (peVar3->buffer_pipeline != (Pl_Buffer *)0x0) {
    pBVar4 = Pl_Buffer::getBuffer(peVar3->buffer_pipeline);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->output_buffer = pBVar4;
    peVar3->buffer_pipeline = (Pl_Buffer *)0x0;
  }
  indicateProgress(this,false,true);
  return extraout_RAX;
}

Assistant:

void
QPDFWriter::write()
{
    doWriteSetup();

    // Set up progress reporting. For linearized files, we write two passes. events_expected is an
    // approximation, but it's good enough for progress reporting, which is mostly a guess anyway.
    m->events_expected = QIntC::to_int(m->pdf.getObjectCount() * (m->linearized ? 2 : 1));

    prepareFileForWrite();

    if (m->linearized) {
        writeLinearized();
    } else {
        writeStandard();
    }

    m->pipeline->finish();
    if (m->close_file) {
        fclose(m->file);
    }
    m->file = nullptr;
    if (m->buffer_pipeline) {
        m->output_buffer = m->buffer_pipeline->getBuffer();
        m->buffer_pipeline = nullptr;
    }
    indicateProgress(false, true);
}